

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O0

Polynom<Rational> __thiscall Polynom<Rational>::power(Polynom<Rational> *this,BigInteger *pow)

{
  bool bVar1;
  Rational *extraout_RDX;
  Rational *in_RDI;
  Polynom<Rational> PVar2;
  BigInteger p;
  Polynom<Rational> a;
  bool t_set;
  Polynom<Rational> *t;
  Polynom<Rational> *in_stack_ffffffffffffff38;
  undefined1 local_a0 [8];
  Rational *in_stack_ffffffffffffff68;
  Polynom<Rational> *in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  Rational::Rational(in_RDI,(longlong)in_stack_ffffffffffffff38);
  Polynom(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Rational::~Rational(in_RDI);
  in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 & 0xffffff;
  Polynom((Polynom<Rational> *)in_RDI,in_stack_ffffffffffffff38);
  abs((int)local_a0);
  while (bVar1 = BigInteger::operator_cast_to_bool((BigInteger *)0x17a2c2), bVar1) {
    bVar1 = BigInteger::odd(&in_RDI->_numerator);
    if (bVar1) {
      if ((in_stack_ffffffffffffff90 & 0x1000000) == 0) {
        operator=((Polynom<Rational> *)in_RDI,in_stack_ffffffffffffff38);
      }
      else {
        operator*=(in_stack_ffffffffffffff70,(Polynom<Rational> *)in_stack_ffffffffffffff68);
      }
      in_stack_ffffffffffffff90 = CONCAT13(1,(int3)in_stack_ffffffffffffff90);
    }
    BigInteger::_divide_by_2
              ((BigInteger *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    bVar1 = BigInteger::operator_cast_to_bool((BigInteger *)0x17a37b);
    if (bVar1) {
      operator*=(in_stack_ffffffffffffff70,(Polynom<Rational> *)in_stack_ffffffffffffff68);
    }
  }
  BigInteger::~BigInteger((BigInteger *)0x17a3a9);
  ~Polynom((Polynom<Rational> *)0x17a3b3);
  PVar2.m.arr = extraout_RDX;
  PVar2.m._0_8_ = in_RDI;
  return (Polynom<Rational>)PVar2.m;
}

Assistant:

const Polynom<Field> Polynom<Field>::power(const BigInteger &pow) const
{
    Polynom t = Polynom(Field(1));
    bool t_set = false;
    Polynom a(*this);
    BigInteger p = abs(pow);
    while(p)
    {
        if(p.odd())
        {
            if(t_set)
                t *= a;
            else
                t = a;
            t_set = true;
        }
        p._divide_by_2();
        if(p)
            a *= a;
    }
    return t;
}